

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O3

shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
 __thiscall
peg::ParserGenerator::perform_core
          (ParserGenerator *this,char *s,size_t n,Rules *rules,string *start,
          bool *enablePackratParsing,Log *log)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  element_type *peVar4;
  pointer pcVar5;
  _Hash_node_base *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Base_ptr p_Var9;
  Log log_00;
  undefined8 uVar10;
  element_type *this_01;
  int iVar11;
  mapped_type *pmVar12;
  ulong uVar13;
  undefined8 *puVar14;
  mapped_type *pmVar15;
  const_iterator cVar16;
  long *plVar17;
  const_iterator cVar18;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
  *__x;
  _Base_ptr p_Var19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  char *pcVar21;
  _Hash_node_base *p_Var22;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var23;
  long *plVar24;
  ulong uVar25;
  _Hash_node_base *p_Var26;
  char *pcVar27;
  _Hash_node_base *p_Var28;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var29;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var30;
  char *col_ptr;
  long lVar31;
  char *__end;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  char *pcVar33;
  ulong uVar34;
  uint uVar35;
  undefined8 uVar36;
  unsigned_long uVar37;
  _Base_ptr p_Var38;
  pointer ppVar39;
  bool bVar40;
  bool bVar41;
  shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
  sVar42;
  _Any_data *in_stack_00000010;
  ReferenceChecker vis;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  referenced;
  Result r;
  Data data;
  _Alloc_hider _Var43;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 uVar44;
  undefined4 in_stack_fffffffffffffc64;
  undefined4 uVar45;
  undefined1 local_378 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  undefined1 local_358 [24];
  undefined1 auStack_340 [8];
  undefined1 local_338 [32];
  undefined1 local_318 [32];
  size_type local_2f8;
  undefined8 *local_2f0;
  undefined8 uStack_2e8;
  undefined4 local_2e0;
  undefined8 local_2d8;
  __node_base_ptr p_Stack_2d0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_2c8;
  _Hash_node_base *local_2c0;
  undefined1 local_2b8 [56];
  element_type *local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_238;
  mapped_type *local_230;
  _Rb_tree_node_base *local_228;
  any local_220;
  string *local_210;
  unsigned_long local_208;
  ulong local_200;
  _Any_data local_1f8;
  code *local_1e8;
  Result local_1d8;
  _Any_data local_150;
  code *local_140;
  Data local_130;
  
  local_238 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)s;
  local_210 = (string *)enablePackratParsing;
  Data::Data(&local_130);
  this_01 = local_130.grammar.
            super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_378._0_8_ = &local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"%recover","");
  pmVar12 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,(key_type *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._0_8_ != &local_368) {
    operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
  }
  local_378._0_8_ = &local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"x","");
  local_1d8.ret = false;
  local_1d8.recovered = false;
  local_1d8._2_6_ = 0;
  local_1d8.len = 0;
  local_1d8.error_info.error_pos = (char *)0x0;
  local_278._M_dataplus._M_p = "";
  local_220._M_manager =
       (_func_void__Op_any_ptr__Arg_ptr *)((ulong)local_220._M_manager & 0xffffffffffffff00);
  std::__shared_ptr<peg::Reference,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<peg::Reference>,std::unordered_map<std::__cxx11::string,peg::Definition,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,peg::Definition>>>const&,std::__cxx11::string_const&,char_const*&,bool&,std::vector<std::shared_ptr<peg::Ope>,std::allocator<std::shared_ptr<peg::Ope>>>const&>
            ((__shared_ptr<peg::Reference,(__gnu_cxx::_Lock_policy)2> *)local_2b8,
             (allocator<peg::Reference> *)&local_258,this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
             (char **)&local_278,(bool *)&local_220,
             (vector<std::shared_ptr<peg::Ope>,_std::allocator<std::shared_ptr<peg::Ope>_>_> *)
             &local_1d8);
  peVar4 = (pmVar12->holder_).super___shared_ptr<peg::Holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar4->ope_).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2b8._0_8_;
  _Var43._M_p = (pointer)local_2b8._0_8_;
  _Var30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar4->ope_).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffc58);
  if (_Var30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var30._M_pi);
  }
  std::vector<std::shared_ptr<peg::Ope>,_std::allocator<std::shared_ptr<peg::Ope>_>_>::~vector
            ((vector<std::shared_ptr<peg::Ope>,_std::allocator<std::shared_ptr<peg::Ope>_>_> *)
             &local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._0_8_ != &local_368) {
    operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar12,0,(char *)(pmVar12->name)._M_string_length,0x14ea73);
  pmVar12->s_ = "[native]";
  pmVar12->ignoreSemanticValue = true;
  pmVar12->is_macro = true;
  local_378._0_8_ = &local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"x","");
  local_228 = (_Rb_tree_node_base *)local_358;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&pmVar12->params,
             local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._0_8_ != &local_368) {
    operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
  }
  local_220._M_manager = std::any::_Manager_internal<peg::ParserGenerator::Data_*>::_S_manage;
  local_378._0_8_ = &local_368;
  local_220._M_storage._M_ptr = &local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"Grammar","");
  pmVar12 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](local_238,(key_type *)local_378);
  std::
  function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_1f8,
             (function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_00000010);
  log_00.super__Function_base._M_functor._8_8_ = _Var43._M_p;
  log_00.super__Function_base._M_functor._M_unused._M_object = &local_1f8;
  log_00.super__Function_base._M_manager = (_Manager_type)_Var30._M_pi;
  log_00._M_invoker._0_4_ = in_stack_fffffffffffffc60;
  log_00._M_invoker._4_4_ = in_stack_fffffffffffffc64;
  Definition::parse(&local_1d8,pmVar12,(char *)n,(size_t)rules,&local_220,(char *)0x0,log_00);
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._0_8_ != &local_368) {
    operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
  }
  if (local_1d8.ret == false) {
    if (*(long *)(in_stack_00000010 + 1) != 0) {
      if (local_1d8.error_info.message_pos == (char *)0x0) {
        uVar35 = 1;
        pcVar33 = (char *)n;
        if (n < local_1d8.error_info.error_pos) {
          do {
            cVar3 = *(char *)n;
            n = n + 1;
            if (cVar3 == '\n') {
              pcVar33 = (char *)n;
            }
            uVar35 = uVar35 + (cVar3 == '\n');
          } while ((char *)n != local_1d8.error_info.error_pos);
          uVar13 = (long)local_1d8.error_info.error_pos - (long)pcVar33;
          if (uVar13 != 0) {
            uVar25 = 0;
            do {
              bVar2 = pcVar33[uVar25];
              lVar31 = 1;
              if ((((char)bVar2 < '\0') &&
                  ((uVar34 = uVar13 - uVar25, uVar34 == 1 || (lVar31 = 2, (bVar2 & 0xe0) != 0xc0))))
                 && ((uVar34 < 3 || (lVar31 = 3, (bVar2 & 0xf0) != 0xe0)))) {
                lVar31 = 0;
                if (3 < uVar34) {
                  lVar31 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
                }
              }
              uVar25 = uVar25 + lVar31;
            } while (uVar25 < uVar13);
          }
        }
        local_378._0_8_ = &local_368;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"syntax error","");
        local_2b8._0_8_ = ZEXT48(uVar35);
        if (*(long *)(in_stack_00000010 + 1) == 0) {
          std::__throw_bad_function_call();
        }
        (**(code **)(in_stack_00000010->_M_pod_data + 0x18))
                  (in_stack_00000010,(unsigned_long *)local_2b8,
                   (unsigned_long *)&stack0xfffffffffffffc50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                   &local_1d8.error_info.label);
        local_2b8._16_8_ = local_368._M_allocated_capacity;
        paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_378._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._0_8_ != &local_368) goto LAB_00116219;
      }
      else {
        local_2b8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x1;
        uVar35 = 1;
        pcVar33 = (char *)n;
        if (n < local_1d8.error_info.message_pos) {
          do {
            pcVar21 = pcVar33 + 1;
            if (*pcVar33 == '\n') {
              n = (size_t)pcVar21;
            }
            uVar35 = uVar35 + (*pcVar33 == '\n');
            pcVar33 = pcVar21;
          } while (pcVar21 != local_1d8.error_info.message_pos);
          uVar13 = (long)local_1d8.error_info.message_pos - n;
          if (uVar13 != 0) {
            local_2b8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1;
            uVar25 = 0;
            do {
              bVar2 = *(byte *)(n + uVar25);
              lVar31 = 1;
              if ((((char)bVar2 < '\0') &&
                  ((uVar34 = uVar13 - uVar25, uVar34 == 1 || (lVar31 = 2, (bVar2 & 0xe0) != 0xc0))))
                 && ((uVar34 < 3 || (lVar31 = 3, (bVar2 & 0xf0) != 0xe0)))) {
                lVar31 = 0;
                if (3 < uVar34) {
                  lVar31 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
                }
              }
              uVar25 = uVar25 + lVar31;
              local_2b8._0_8_ = local_2b8._0_8_ + 1;
            } while (uVar25 < uVar13);
          }
        }
        local_378._0_8_ = ZEXT48(uVar35);
        (**(code **)(in_stack_00000010->_M_pod_data + 0x18))
                  (in_stack_00000010,(unsigned_long *)local_378,(unsigned_long *)local_2b8,
                   &local_1d8.error_info.message,&local_1d8.error_info.label);
      }
    }
  }
  else {
    plVar17 = (long *)(start->field_2)._M_allocated_capacity;
    local_280 = &this->g;
    if (plVar17 != (long *)0x0) {
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>
                *)local_378,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>
                *)(plVar17 + 1));
        local_2b8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_2b8 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2b8,local_378._0_8_,
                   (char *)(local_378._0_8_ + (long)(__buckets_ptr *)local_378._8_8_));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (*(char *)local_2b8._0_8_ == '~') {
            std::__cxx11::string::erase((ulong)local_2b8,0);
            bVar41 = true;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_ ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00114ac7;
          }
          else {
            bVar41 = false;
          }
          pmVar12 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_01,(key_type *)local_2b8);
          peVar4 = (pmVar12->holder_).super___shared_ptr<peg::Holder,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          (peVar4->ope_).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_358._0_8_;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(peVar4->ope_).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_358 + 8));
          std::__cxx11::string::_M_assign((string *)pmVar12);
          pmVar12->ignoreSemanticValue = bVar41;
        }
LAB_00114ac7:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2b8 + 0x10)) {
          operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT44(local_358._12_4_,local_358._8_4_) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT44(local_358._12_4_,local_358._8_4_));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._0_8_ != &local_368) {
          operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
        }
        plVar17 = (long *)*plVar17;
      } while (plVar17 != (long *)0x0);
    }
    if (local_130.duplicates_of_definition.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_130.duplicates_of_definition.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar41 = true;
    }
    else {
      ppVar39 = local_130.duplicates_of_definition.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (*(long *)(in_stack_00000010 + 1) != 0) {
          pcVar33 = ppVar39->second;
          paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1;
          uVar35 = 1;
          pcVar21 = (char *)n;
          pcVar27 = (char *)n;
          if (n < pcVar33) {
            do {
              pcVar1 = pcVar27 + 1;
              if (*pcVar27 == '\n') {
                pcVar21 = pcVar1;
              }
              uVar35 = uVar35 + (*pcVar27 == '\n');
              pcVar27 = pcVar1;
            } while (pcVar1 != pcVar33);
            uVar13 = (long)pcVar33 - (long)pcVar21;
            if (uVar13 != 0) {
              paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x1;
              uVar25 = 0;
              do {
                bVar2 = pcVar21[uVar25];
                lVar31 = 1;
                if ((((char)bVar2 < '\0') &&
                    ((uVar34 = uVar13 - uVar25, uVar34 == 1 || (lVar31 = 2, (bVar2 & 0xe0) != 0xc0))
                    )) && ((uVar34 < 3 || (lVar31 = 3, (bVar2 & 0xf0) != 0xe0)))) {
                  lVar31 = 0;
                  if (3 < uVar34) {
                    lVar31 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
                  }
                }
                uVar25 = uVar25 + lVar31;
                paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)paVar32 + 1);
              } while (uVar25 < uVar13);
            }
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2b8,"The definition \'",&ppVar39->first);
          puVar14 = (undefined8 *)std::__cxx11::string::append((char *)local_2b8);
          local_378._0_8_ = &local_368;
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 == paVar20) {
            local_368._M_allocated_capacity = paVar20->_M_allocated_capacity;
            local_368._8_8_ = puVar14[3];
          }
          else {
            local_368._M_allocated_capacity = paVar20->_M_allocated_capacity;
            local_378._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar14;
          }
          local_378._8_8_ = puVar14[1];
          *puVar14 = paVar20;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          _Var43._M_p = &stack0xfffffffffffffc60;
          std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc50,"");
          local_278._M_dataplus._M_p = (pointer)(ulong)uVar35;
          local_258._M_dataplus._M_p = (pointer)paVar32;
          if (*(long *)(in_stack_00000010 + 1) == 0) {
            std::__throw_bad_function_call();
          }
          (**(code **)(in_stack_00000010->_M_pod_data + 0x18))
                    (in_stack_00000010,(unsigned_long *)&local_278,(unsigned_long *)&local_258,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffc50);
          if (_Var43._M_p != &stack0xfffffffffffffc60) {
            operator_delete(_Var43._M_p,
                            CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._0_8_ != &local_368) {
            operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2b8 + 0x10)) {
            operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
          }
        }
        ppVar39 = ppVar39 + 1;
      } while (ppVar39 !=
               local_130.duplicates_of_definition.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
      bVar41 = false;
    }
    if (local_130.duplicates_of_instruction.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_130.duplicates_of_instruction.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppVar39 = local_130.duplicates_of_instruction.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (*(long *)(in_stack_00000010 + 1) != 0) {
          pcVar33 = ppVar39->second;
          paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1;
          uVar35 = 1;
          pcVar21 = (char *)n;
          pcVar27 = (char *)n;
          if (n < pcVar33) {
            do {
              pcVar1 = pcVar27 + 1;
              if (*pcVar27 == '\n') {
                pcVar21 = pcVar1;
              }
              uVar35 = uVar35 + (*pcVar27 == '\n');
              pcVar27 = pcVar1;
            } while (pcVar1 != pcVar33);
            uVar13 = (long)pcVar33 - (long)pcVar21;
            if (uVar13 != 0) {
              paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x1;
              uVar25 = 0;
              do {
                bVar2 = pcVar21[uVar25];
                lVar31 = 1;
                if ((((char)bVar2 < '\0') &&
                    ((uVar34 = uVar13 - uVar25, uVar34 == 1 || (lVar31 = 2, (bVar2 & 0xe0) != 0xc0))
                    )) && ((uVar34 < 3 || (lVar31 = 3, (bVar2 & 0xf0) != 0xe0)))) {
                  lVar31 = 0;
                  if (3 < uVar34) {
                    lVar31 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
                  }
                }
                uVar25 = uVar25 + lVar31;
                paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)paVar32 + 1);
              } while (uVar25 < uVar13);
            }
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2b8,"The instruction \'",&ppVar39->first);
          puVar14 = (undefined8 *)std::__cxx11::string::append((char *)local_2b8);
          local_378._0_8_ = &local_368;
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 == paVar20) {
            local_368._M_allocated_capacity = paVar20->_M_allocated_capacity;
            local_368._8_8_ = puVar14[3];
          }
          else {
            local_368._M_allocated_capacity = paVar20->_M_allocated_capacity;
            local_378._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar14;
          }
          local_378._8_8_ = puVar14[1];
          *puVar14 = paVar20;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          _Var43._M_p = &stack0xfffffffffffffc60;
          std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc50,"");
          local_278._M_dataplus._M_p = (pointer)(ulong)uVar35;
          local_258._M_dataplus._M_p = (pointer)paVar32;
          if (*(long *)(in_stack_00000010 + 1) == 0) {
            std::__throw_bad_function_call();
          }
          (**(code **)(in_stack_00000010->_M_pod_data + 0x18))
                    (in_stack_00000010,(unsigned_long *)&local_278,(unsigned_long *)&local_258,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffc50);
          if (_Var43._M_p != &stack0xfffffffffffffc60) {
            operator_delete(_Var43._M_p,
                            CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._0_8_ != &local_368) {
            operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2b8 + 0x10)) {
            operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
          }
        }
        ppVar39 = ppVar39 + 1;
      } while (ppVar39 !=
               local_130.duplicates_of_instruction.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
      bVar41 = false;
    }
    if (local_130.undefined_back_references.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_130.undefined_back_references.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppVar39 = local_130.undefined_back_references.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (*(long *)(in_stack_00000010 + 1) != 0) {
          pcVar33 = ppVar39->second;
          paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1;
          uVar35 = 1;
          pcVar21 = (char *)n;
          pcVar27 = (char *)n;
          if (n < pcVar33) {
            do {
              pcVar1 = pcVar27 + 1;
              if (*pcVar27 == '\n') {
                pcVar21 = pcVar1;
              }
              uVar35 = uVar35 + (*pcVar27 == '\n');
              pcVar27 = pcVar1;
            } while (pcVar1 != pcVar33);
            uVar13 = (long)pcVar33 - (long)pcVar21;
            if (uVar13 != 0) {
              paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x1;
              uVar25 = 0;
              do {
                bVar2 = pcVar21[uVar25];
                lVar31 = 1;
                if ((((char)bVar2 < '\0') &&
                    ((uVar34 = uVar13 - uVar25, uVar34 == 1 || (lVar31 = 2, (bVar2 & 0xe0) != 0xc0))
                    )) && ((uVar34 < 3 || (lVar31 = 3, (bVar2 & 0xf0) != 0xe0)))) {
                  lVar31 = 0;
                  if (3 < uVar34) {
                    lVar31 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
                  }
                }
                uVar25 = uVar25 + lVar31;
                paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)paVar32 + 1);
              } while (uVar25 < uVar13);
            }
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2b8,"The back reference \'",&ppVar39->first);
          puVar14 = (undefined8 *)std::__cxx11::string::append((char *)local_2b8);
          local_378._0_8_ = &local_368;
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 == paVar20) {
            local_368._M_allocated_capacity = paVar20->_M_allocated_capacity;
            local_368._8_8_ = puVar14[3];
          }
          else {
            local_368._M_allocated_capacity = paVar20->_M_allocated_capacity;
            local_378._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar14;
          }
          local_378._8_8_ = puVar14[1];
          *puVar14 = paVar20;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          _Var43._M_p = &stack0xfffffffffffffc60;
          std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc50,"");
          local_278._M_dataplus._M_p = (pointer)(ulong)uVar35;
          local_258._M_dataplus._M_p = (pointer)paVar32;
          if (*(long *)(in_stack_00000010 + 1) == 0) {
            std::__throw_bad_function_call();
          }
          (**(code **)(in_stack_00000010->_M_pod_data + 0x18))
                    (in_stack_00000010,(unsigned_long *)&local_278,(unsigned_long *)&local_258,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffc50);
          if (_Var43._M_p != &stack0xfffffffffffffc60) {
            operator_delete(_Var43._M_p,
                            CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._0_8_ != &local_368) {
            operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2b8 + 0x10)) {
            operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
          }
        }
        ppVar39 = ppVar39 + 1;
      } while (ppVar39 !=
               local_130.undefined_back_references.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
      bVar41 = false;
    }
    pmVar12 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_01,&local_130.start);
    this = (ParserGenerator *)local_280;
    if (pmVar12->ignoreSemanticValue == true) {
      if (*(long *)(in_stack_00000010 + 1) != 0) {
        pcVar33 = pmVar12->s_;
        paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x1;
        uVar35 = 1;
        pcVar21 = (char *)n;
        if (n < pcVar33) {
          do {
            cVar3 = *(char *)n;
            n = n + 1;
            if (cVar3 == '\n') {
              pcVar21 = (char *)n;
            }
            uVar35 = uVar35 + (cVar3 == '\n');
          } while ((char *)n != pcVar33);
          uVar13 = (long)pcVar33 - (long)pcVar21;
          if (uVar13 != 0) {
            paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x1;
            uVar25 = 0;
            do {
              bVar2 = pcVar21[uVar25];
              lVar31 = 1;
              if ((((char)bVar2 < '\0') &&
                  ((uVar34 = uVar13 - uVar25, uVar34 == 1 || (lVar31 = 2, (bVar2 & 0xe0) != 0xc0))))
                 && ((uVar34 < 3 || (lVar31 = 3, (bVar2 & 0xf0) != 0xe0)))) {
                lVar31 = 0;
                if (3 < uVar34) {
                  lVar31 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
                }
              }
              uVar25 = uVar25 + lVar31;
              paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)paVar32 + 1);
            } while (uVar25 < uVar13);
          }
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b8,"Ignore operator cannot be applied to \'",&pmVar12->name);
        puVar14 = (undefined8 *)std::__cxx11::string::append(local_2b8);
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 == paVar20) {
          local_368._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_368._8_8_ = puVar14[3];
          local_378._0_8_ = &local_368;
        }
        else {
          local_368._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_378._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar14;
        }
        local_378._8_8_ = puVar14[1];
        *puVar14 = paVar20;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        _Var43._M_p = &stack0xfffffffffffffc60;
        std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc50,"");
        local_278._M_dataplus._M_p = (pointer)(ulong)uVar35;
        local_258._M_dataplus._M_p = (pointer)paVar32;
        if (*(long *)(in_stack_00000010 + 1) == 0) {
          std::__throw_bad_function_call();
        }
        (**(code **)(in_stack_00000010->_M_pod_data + 0x18))
                  (in_stack_00000010,(unsigned_long *)&local_278,(unsigned_long *)&local_258,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffc50);
        this = (ParserGenerator *)local_280;
        if (_Var43._M_p != &stack0xfffffffffffffc60) {
          operator_delete(_Var43._M_p,
                          CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._0_8_ != &local_368) {
          operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
        }
        paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2b8 + 0x10)) {
LAB_00116219:
          operator_delete(paVar32,(ulong)((long)&((_Hash_node_base *)local_2b8._16_8_)->_M_nxt + 1))
          ;
          this = (ParserGenerator *)&this->g;
        }
      }
    }
    else if (bVar41) {
      local_378._0_8_ = &local_368;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"%whitespace","");
      local_358._0_8_ = local_358 + 0x10;
      local_230 = pmVar12;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"%word","");
      local_338._0_8_ = local_338 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"%recover","");
      plVar17 = (long *)(local_318 + 0x10);
      pcVar5 = (local_230->name)._M_dataplus._M_p;
      local_318._0_8_ = plVar17;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_318,pcVar5,pcVar5 + (local_230->name)._M_string_length);
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_2b8,local_378,&local_2f8,0,&stack0xfffffffffffffc50,&local_278,&local_258)
      ;
      lVar31 = -0x80;
      do {
        if (plVar17 != (long *)plVar17[-2]) {
          operator_delete((long *)plVar17[-2],*plVar17 + 1);
        }
        plVar17 = plVar17 + -4;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0);
      p_Var26 = ((__node_base *)((long)this_01 + 0x10))->_M_nxt;
      if (p_Var26 != (_Hash_node_base *)0x0) {
        do {
          local_2c0 = p_Var26 + 0x23;
          local_378._0_8_ = &PTR__ReferenceChecker_00170798;
          local_378._8_8_ = auStack_340;
          local_368._M_allocated_capacity = 1;
          local_368._8_8_ = (long *)0x0;
          local_358._0_8_ = (_Hash_node_base *)0x0;
          local_358._8_4_ = 0x3f800000;
          local_358._16_8_ = (_Base_ptr)0x0;
          auStack_340 = (undefined1  [8])0x0;
          local_338._0_8_ = local_318 + 0x10;
          local_338._8_8_ = (_Hash_node_base *)0x1;
          local_338._16_8_ = (_Hash_node_base *)0x0;
          local_338._24_8_ = 0;
          local_318._0_4_ = 0x3f800000;
          local_318._8_8_ = (_Base_ptr)0x0;
          local_318._16_8_ = (_Base_ptr)0x0;
          local_318._24_8_ = &p_Stack_2d0;
          local_2f8 = 1;
          local_2f0 = (undefined8 *)0x0;
          uStack_2e8 = 0;
          local_2e0 = 0x3f800000;
          local_2d8 = 0;
          p_Stack_2d0 = (__node_base_ptr)0x0;
          local_2c8 = &this_01->_M_h;
          (*(code *)(p_Var26[0x3d]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var26[0x3d]._M_nxt,local_378);
          _Var43._M_p = (pointer)local_2b8;
          for (puVar14 = local_2f0; puVar14 != (undefined8 *)0x0; puVar14 = (undefined8 *)*puVar14)
          {
            std::
            _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                      ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)local_2b8,puVar14 + 1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffffc50);
          }
          uVar36 = local_368._8_8_;
          if ((long *)local_368._8_8_ != (long *)0x0) {
            do {
              if (*(long *)(in_stack_00000010 + 1) != 0) {
                pcVar33 = *(char **)(uVar36 + 0x28);
                paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x1;
                uVar35 = 1;
                pcVar21 = (char *)n;
                pcVar27 = (char *)n;
                if (n < pcVar33) {
                  do {
                    pcVar1 = pcVar27 + 1;
                    if (*pcVar27 == '\n') {
                      pcVar21 = pcVar1;
                    }
                    uVar35 = uVar35 + (*pcVar27 == '\n');
                    pcVar27 = pcVar1;
                  } while (pcVar1 != pcVar33);
                  uVar13 = (long)pcVar33 - (long)pcVar21;
                  if (uVar13 != 0) {
                    paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x1;
                    uVar25 = 0;
                    do {
                      bVar2 = pcVar21[uVar25];
                      lVar31 = 1;
                      if ((((char)bVar2 < '\0') &&
                          ((uVar34 = uVar13 - uVar25, uVar34 == 1 ||
                           (lVar31 = 2, (bVar2 & 0xe0) != 0xc0)))) &&
                         ((uVar34 < 3 || (lVar31 = 3, (bVar2 & 0xf0) != 0xe0)))) {
                        lVar31 = 0;
                        if (3 < uVar34) {
                          lVar31 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
                        }
                      }
                      uVar25 = uVar25 + lVar31;
                      paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)((long)paVar32 + 1);
                    } while (uVar25 < uVar13);
                  }
                }
                pmVar15 = std::__detail::
                          _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)local_338,(key_type *)(uVar36 + 8));
                _Var43._M_p = &stack0xfffffffffffffc60;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&stack0xfffffffffffffc50,"","");
                local_278._M_dataplus._M_p = (pointer)(ulong)uVar35;
                local_258._M_dataplus._M_p = (pointer)paVar32;
                if (*(long *)(in_stack_00000010 + 1) == 0) {
                  std::__throw_bad_function_call();
                }
                (**(code **)(in_stack_00000010->_M_pod_data + 0x18))
                          (in_stack_00000010,(unsigned_long *)&local_278,(unsigned_long *)&local_258
                           ,pmVar15,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&stack0xfffffffffffffc50);
                if ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                     *)_Var43._M_p !=
                    (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                     *)&stack0xfffffffffffffc60) {
                  operator_delete(_Var43._M_p,
                                  CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60) + 1)
                  ;
                }
              }
              uVar36 = *(undefined8 *)uVar36;
            } while (uVar36 != 0);
            bVar41 = false;
          }
          local_378._0_8_ = &PTR__ReferenceChecker_00170798;
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)(local_318 + 0x18));
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_338);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)(local_378 + 8));
          p_Var26 = p_Var26->_M_nxt;
        } while (p_Var26 != (_Hash_node_base *)0x0);
        p_Var26 = ((__node_base *)((long)this_01 + 0x10))->_M_nxt;
        if (p_Var26 != (_Hash_node_base *)0x0) {
          do {
            cVar16 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)local_2b8,(key_type *)(p_Var26 + 1));
            if ((cVar16.
                 super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ._M_cur == (__node_type *)0x0) && (*(long *)(in_stack_00000010 + 1) != 0)) {
              p_Var6 = p_Var26[9]._M_nxt;
              paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x1;
              uVar35 = 1;
              p_Var22 = (_Hash_node_base *)n;
              p_Var28 = (_Hash_node_base *)n;
              if (n < p_Var6) {
                do {
                  bVar40 = *(char *)&p_Var28->_M_nxt == '\n';
                  p_Var28 = (_Hash_node_base *)((long)&p_Var28->_M_nxt + 1);
                  if (bVar40) {
                    p_Var22 = p_Var28;
                  }
                  uVar35 = uVar35 + bVar40;
                } while (p_Var28 != p_Var6);
                uVar13 = (long)p_Var6 - (long)p_Var22;
                if (uVar13 != 0) {
                  paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x1;
                  uVar25 = 0;
                  do {
                    bVar2 = *(byte *)((long)&p_Var22->_M_nxt + uVar25);
                    lVar31 = 1;
                    if ((((char)bVar2 < '\0') &&
                        ((uVar34 = uVar13 - uVar25, uVar34 == 1 ||
                         (lVar31 = 2, (bVar2 & 0xe0) != 0xc0)))) &&
                       ((uVar34 < 3 || (lVar31 = 3, (bVar2 & 0xf0) != 0xe0)))) {
                      lVar31 = 0;
                      if (3 < uVar34) {
                        lVar31 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
                      }
                    }
                    uVar25 = uVar25 + lVar31;
                    paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)((long)paVar32 + 1);
                  } while (uVar25 < uVar13);
                }
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stack0xfffffffffffffc50,"\'",(key_type *)(p_Var26 + 1));
              puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&stack0xfffffffffffffc50)
              ;
              local_378._0_8_ = &local_368;
              paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar14 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar14 == paVar20) {
                local_368._M_allocated_capacity = paVar20->_M_allocated_capacity;
                local_368._8_8_ = puVar14[3];
              }
              else {
                local_368._M_allocated_capacity = paVar20->_M_allocated_capacity;
                local_378._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar14;
              }
              local_378._8_8_ = puVar14[1];
              *puVar14 = paVar20;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              if ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                   *)_Var43._M_p !=
                  (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                   *)&stack0xfffffffffffffc60) {
                operator_delete(_Var43._M_p,
                                CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60) + 1);
              }
              _Var43._M_p = &stack0xfffffffffffffc60;
              std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc50,"")
              ;
              local_278._M_dataplus._M_p = (pointer)(ulong)uVar35;
              local_258._M_dataplus._M_p = (pointer)paVar32;
              if (*(long *)(in_stack_00000010 + 1) == 0) {
                std::__throw_bad_function_call();
              }
              (**(code **)(in_stack_00000010->_M_pod_data + 0x18))
                        (in_stack_00000010,(unsigned_long *)&local_278,(unsigned_long *)&local_258,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_378,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xfffffffffffffc50);
              if ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                   *)_Var43._M_p !=
                  (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                   *)&stack0xfffffffffffffc60) {
                operator_delete(_Var43._M_p,
                                CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_378._0_8_ != &local_368) {
                operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1)
                               );
              }
            }
            p_Var26 = p_Var26->_M_nxt;
          } while (p_Var26 != (_Hash_node_base *)0x0);
        }
      }
      this = (ParserGenerator *)local_280;
      if (bVar41) {
        p_Var26 = ((__node_base *)((long)this_01 + 0x10))->_M_nxt;
        if (p_Var26 != (_Hash_node_base *)0x0) {
          do {
            local_368._M_allocated_capacity = (size_type)(p_Var26 + 0x23);
            local_378._0_8_ = &PTR__Visitor_00170888;
            local_378._8_8_ = this_01;
            (*(code *)(p_Var26[0x3d]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var26[0x3d]._M_nxt,local_378);
            p_Var26 = p_Var26->_M_nxt;
          } while (p_Var26 != (_Hash_node_base *)0x0);
          p_Var26 = ((__node_base *)((long)this_01 + 0x10))->_M_nxt;
          if (p_Var26 != (_Hash_node_base *)0x0) {
            bVar41 = true;
            do {
              local_378._0_8_ = &PTR__DetectLeftRecursion_001704c8;
              local_378._8_8_ =
                   (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)0x0;
              local_368._M_allocated_capacity = (size_type)local_358;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_368,p_Var26[1]._M_nxt,
                         (long)&(p_Var26[1]._M_nxt)->_M_nxt + (long)&(p_Var26[2]._M_nxt)->_M_nxt);
              local_358._16_8_ = local_318;
              auStack_340 = (undefined1  [8])0x1;
              local_338._0_8_ = (__buckets_ptr)0x0;
              local_338._8_8_ = (_Hash_node_base *)0x0;
              local_338._16_4_ = 0x3f800000;
              local_338._24_8_ = 0;
              local_318._0_8_ = (long *)0x0;
              local_318._8_8_ = local_318._8_8_ & 0xffffffffffffff00;
              (*(code *)(p_Var26[0x3d]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var26[0x3d]._M_nxt,local_378);
              if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_378._8_8_ !=
                  (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)0x0) {
                if (*(long *)(in_stack_00000010 + 1) != 0) {
                  uVar37 = 1;
                  uVar35 = 1;
                  p_Var23 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)n;
                  p_Var29 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)n;
                  if (n < (ulong)local_378._8_8_) {
                    do {
                      bVar41 = *(char *)&p_Var29->_M_buckets == '\n';
                      p_Var29 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)((long)&p_Var29->_M_buckets + 1);
                      if (bVar41) {
                        p_Var23 = p_Var29;
                      }
                      uVar35 = uVar35 + bVar41;
                    } while (p_Var29 !=
                             (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)local_378._8_8_);
                    uVar13 = local_378._8_8_ - (long)p_Var23;
                    if (uVar13 != 0) {
                      uVar37 = 1;
                      uVar25 = 0;
                      do {
                        bVar2 = *(byte *)((long)&p_Var23->_M_buckets + uVar25);
                        lVar31 = 1;
                        if ((((char)bVar2 < '\0') &&
                            ((uVar34 = uVar13 - uVar25, uVar34 == 1 ||
                             (lVar31 = 2, (bVar2 & 0xe0) != 0xc0)))) &&
                           ((uVar34 < 3 || (lVar31 = 3, (bVar2 & 0xf0) != 0xe0)))) {
                          lVar31 = 0;
                          if (3 < uVar34) {
                            lVar31 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
                          }
                        }
                        uVar25 = uVar25 + lVar31;
                        uVar37 = uVar37 + 1;
                      } while (uVar25 < uVar13);
                    }
                  }
                  std::operator+(&local_278,"\'",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(p_Var26 + 1));
                  plVar17 = (long *)std::__cxx11::string::append((char *)&local_278);
                  _Var43._M_p = &stack0xfffffffffffffc60;
                  plVar24 = plVar17 + 2;
                  if ((long *)*plVar17 == plVar24) {
                    uVar44 = (undefined4)*plVar24;
                    uVar45 = *(undefined4 *)((long)plVar17 + 0x14);
                  }
                  else {
                    uVar44 = (undefined4)*plVar24;
                    uVar45 = (undefined4)((ulong)*plVar24 >> 0x20);
                    _Var43._M_p = (pointer)*plVar17;
                  }
                  *plVar17 = (long)plVar24;
                  plVar17[1] = 0;
                  *(undefined1 *)(plVar17 + 2) = 0;
                  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"");
                  local_200 = (ulong)uVar35;
                  local_208 = uVar37;
                  if (*(long *)(in_stack_00000010 + 1) == 0) {
                    std::__throw_bad_function_call();
                  }
                  (**(code **)(in_stack_00000010->_M_pod_data + 0x18))
                            (in_stack_00000010,&local_200,&local_208,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stack0xfffffffffffffc50,&local_258);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_258._M_dataplus._M_p != &local_258.field_2) {
                    operator_delete(local_258._M_dataplus._M_p,
                                    local_258.field_2._M_allocated_capacity + 1);
                  }
                  if (_Var43._M_p != &stack0xfffffffffffffc60) {
                    operator_delete(_Var43._M_p,CONCAT44(uVar45,uVar44) + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_278._M_dataplus._M_p != &local_278.field_2) {
                    operator_delete(local_278._M_dataplus._M_p,
                                    local_278.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar41 = false;
              }
              local_378._0_8_ = &PTR__DetectLeftRecursion_001704c8;
              std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)(local_358 + 0x10));
              if ((_Hash_node_base *)local_368._M_allocated_capacity != (_Hash_node_base *)local_358
                 ) {
                operator_delete((void *)local_368._M_allocated_capacity,
                                (ulong)((long)(_Hash_node_base **)local_358._0_8_ + 1));
              }
              p_Var26 = p_Var26->_M_nxt;
            } while (p_Var26 != (_Hash_node_base *)0x0);
            this = (ParserGenerator *)local_280;
            if (!bVar41) goto LAB_001164c5;
          }
        }
        bVar41 = detect_infiniteLoop((ParserGenerator *)local_238,&local_130,local_230,
                                     (Log *)in_stack_00000010,(char *)n);
        if (bVar41) goto LAB_001164c5;
        local_378._0_8_ = &local_368;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"%whitespace","");
        cVar18 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this_01->_M_h,(key_type *)local_378);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._0_8_ != &local_368) {
          operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
        }
        if (cVar18.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_true>
            ._M_cur != (__node_type *)0x0) {
          p_Var26 = ((__node_base *)((long)this_01 + 0x10))->_M_nxt;
          if (p_Var26 != (_Hash_node_base *)0x0) {
            do {
              p_Var28 = p_Var26[0x3d]._M_nxt[1]._M_nxt;
              _Var30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             p_Var26[0x3d]._M_nxt[2]._M_nxt;
              if (_Var30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (_Var30._M_pi)->_M_use_count = (_Var30._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (_Var30._M_pi)->_M_use_count = (_Var30._M_pi)->_M_use_count + 1;
                }
              }
              local_378._0_8_ = &PTR__Visitor_00170ca0;
              local_378._8_8_ = local_378._8_8_ & 0xffffffffffffff00;
              (*(code *)p_Var28->_M_nxt[3]._M_nxt)(p_Var28,local_378);
              if (local_378[8] == _S_black) {
                local_378._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<peg::TokenBoundary,std::allocator<peg::TokenBoundary>,std::shared_ptr<peg::Ope>const&>
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_378 + 8),
                           (TokenBoundary **)local_378,(allocator<peg::TokenBoundary> *)&local_258,
                           (shared_ptr<peg::Ope> *)&stack0xfffffffffffffc50);
                local_278._M_dataplus._M_p = (pointer)local_378._0_8_;
                local_278._M_string_length = local_378._8_8_;
                p_Var28 = p_Var26[0x3d]._M_nxt;
                p_Var28[1]._M_nxt = (_Hash_node_base *)local_378._0_8_;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var28 + 2),
                           (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_278._M_string_length
                          );
                if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_278._M_string_length !=
                    (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_278._M_string_length);
                }
              }
              if (_Var30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var30._M_pi);
              }
              p_Var26 = p_Var26->_M_nxt;
            } while (p_Var26 != (_Hash_node_base *)0x0);
          }
          local_378._0_8_ = &local_368;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"%whitespace","");
          pmVar12 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_01,(key_type *)local_378);
          this = (ParserGenerator *)local_280;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._0_8_ != &local_368) {
            operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
          }
          _Var30._M_pi = (((pmVar12->holder_).
                           super___shared_ptr<peg::Holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ope_
                         ).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi;
          if (_Var30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Var30._M_pi)->_M_use_count = (_Var30._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Var30._M_pi)->_M_use_count = (_Var30._M_pi)->_M_use_count + 1;
            }
          }
          wsp((peg *)local_378,(shared_ptr<peg::Ope> *)&stack0xfffffffffffffc50);
          uVar10 = local_378._8_8_;
          uVar36 = local_378._0_8_;
          local_378._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_378._8_8_ =
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)0x0;
          p_Var7 = (local_230->whitespaceOpe).
                   super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          (local_230->whitespaceOpe).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)uVar36;
          (local_230->whitespaceOpe).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10;
          if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
             (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)local_378._8_8_ !=
             (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_378._8_8_);
          }
          if (_Var30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var30._M_pi);
          }
          bVar41 = detect_infiniteLoop((ParserGenerator *)local_238,&local_130,pmVar12,
                                       (Log *)in_stack_00000010,(char *)n);
          if (bVar41) goto LAB_001164c5;
        }
        local_378._0_8_ = &local_368;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"%word","");
        cVar18 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this_01->_M_h,(key_type *)local_378);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._0_8_ != &local_368) {
          operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
        }
        if (cVar18.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_true>
            ._M_cur != (__node_type *)0x0) {
          local_378._0_8_ = &local_368;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"%word","");
          pmVar12 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_01,(key_type *)local_378);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._0_8_ != &local_368) {
            operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
          }
          peVar4 = (pmVar12->holder_).super___shared_ptr<peg::Holder,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          peVar8 = (peVar4->ope_).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var7 = (peVar4->ope_).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            }
          }
          (local_230->wordOpe).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               peVar8;
          this_00 = (local_230->wordOpe).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          (local_230->wordOpe).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = p_Var7;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          bVar41 = detect_infiniteLoop((ParserGenerator *)local_238,&local_130,pmVar12,
                                       (Log *)in_stack_00000010,(char *)n);
          if (bVar41) goto LAB_001164c5;
        }
        if ((_Rb_tree_header *)
            local_130.instructions._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
            &local_130.instructions._M_t._M_impl.super__Rb_tree_header) {
          p_Var19 = local_130.instructions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            pmVar12 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this_01,(key_type *)(p_Var19 + 1));
            p_Var38 = *(_Base_ptr *)(p_Var19 + 2);
            p_Var9 = p_Var19[2]._M_parent;
            local_228 = p_Var19;
            if (p_Var38 != p_Var9) {
              do {
                iVar11 = std::__cxx11::string::compare((char *)p_Var38);
                if (iVar11 == 0) {
                  __x = (_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
                         *)std::
                           __any_caster<std::map<std::basic_string_view<char,std::char_traits<char>>,std::pair<unsigned_long,char>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,char>>>>>
                                     ((any *)(p_Var38 + 1));
                  if (__x == (_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
                              *)0x0) {
                    std::__throw_bad_any_cast();
                  }
                  std::
                  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
                  ::_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
                              *)local_378,__x);
                  std::
                  function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  ::function((function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)&local_150,
                             (function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)in_stack_00000010);
                  bVar41 = apply_precedence_instruction
                                     ((ParserGenerator *)local_238,pmVar12,(BinOpeInfo *)local_378,
                                      (char *)n,(Log *)&local_150);
                  if (local_140 != (code *)0x0) {
                    (*local_140)(&local_150,&local_150,__destroy_functor);
                  }
                  this = (ParserGenerator *)local_280;
                  if (!bVar41) {
                    ((_Hashtable *)&(local_280->_M_h)._M_buckets)->_M_buckets = (__buckets_ptr)0x0;
                    (local_280->_M_h)._M_bucket_count = 0;
                    std::
                    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
                    ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
                                 *)local_378);
                    goto LAB_001164cc;
                  }
                  std::
                  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
                  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
                               *)local_378);
                }
                else {
                  iVar11 = std::__cxx11::string::compare((char *)p_Var38);
                  if (iVar11 == 0) {
                    plVar17 = (long *)std::__any_caster<std::__cxx11::string>((any *)(p_Var38 + 1));
                    if (plVar17 == (long *)0x0) {
                      std::__throw_bad_any_cast();
                    }
                    local_378._0_8_ = &local_368;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_378,*plVar17,plVar17[1] + *plVar17);
                    std::__cxx11::string::operator=
                              ((string *)&pmVar12->error_message,(string *)local_378);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_378._0_8_ != &local_368) {
                      operator_delete((void *)local_378._0_8_,
                                      (ulong)(local_368._M_allocated_capacity + 1));
                    }
                  }
                  else {
                    iVar11 = std::__cxx11::string::compare((char *)p_Var38);
                    if (iVar11 == 0) {
                      pmVar12->no_ast_opt = true;
                    }
                  }
                }
                p_Var38 = p_Var38 + 2;
              } while (p_Var38 != p_Var9);
            }
            p_Var19 = (_Base_ptr)std::_Rb_tree_increment(local_228);
          } while ((_Rb_tree_header *)p_Var19 !=
                   &local_130.instructions._M_t._M_impl.super__Rb_tree_header);
        }
        std::__cxx11::string::_M_assign(local_210);
        (log->super__Function_base)._M_functor._M_pod_data[0] = local_130.enablePackratParsing;
        ((_Hashtable *)&(local_280->_M_h)._M_buckets)->_M_buckets =
             (__buckets_ptr)
             local_130.grammar.
             super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        (local_280->_M_h)._M_bucket_count =
             (size_type)
             local_130.grammar.
             super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        this = (ParserGenerator *)local_280;
        if (local_130.grammar.
            super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_130.grammar.
             super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_130.grammar.
                  super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_130.grammar.
             super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_130.grammar.
                  super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
      }
      else {
LAB_001164c5:
        ((_Hashtable *)&(this->g)._M_h._M_buckets)->_M_buckets = (__buckets_ptr)0x0;
        (this->g)._M_h._M_bucket_count = 0;
      }
LAB_001164cc:
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_2b8);
      goto LAB_00116228;
    }
  }
  ((_Hashtable *)&(this->g)._M_h._M_buckets)->_M_buckets = (__buckets_ptr)0x0;
  (this->g)._M_h._M_bucket_count = 0;
LAB_00116228:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.error_info.label._M_dataplus._M_p != &local_1d8.error_info.label.field_2) {
    operator_delete(local_1d8.error_info.label._M_dataplus._M_p,
                    local_1d8.error_info.label.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.error_info.message._M_dataplus._M_p != &local_1d8.error_info.message.field_2) {
    operator_delete(local_1d8.error_info.message._M_dataplus._M_p,
                    local_1d8.error_info.message.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8.error_info.expected_tokens.
      super__Vector_base<std::pair<const_char_*,_const_peg::Definition_*>,_std::allocator<std::pair<const_char_*,_const_peg::Definition_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.error_info.expected_tokens.
                    super__Vector_base<std::pair<const_char_*,_const_peg::Definition_*>,_std::allocator<std::pair<const_char_*,_const_peg::Definition_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.error_info.expected_tokens.
                          super__Vector_base<std::pair<const_char_*,_const_peg::Definition_*>,_std::allocator<std::pair<const_char_*,_const_peg::Definition_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.error_info.expected_tokens.
                          super__Vector_base<std::pair<const_char_*,_const_peg::Definition_*>,_std::allocator<std::pair<const_char_*,_const_peg::Definition_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_220._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_220._M_manager)(_Op_destroy,&local_220,(_Arg *)0x0);
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Rb_tree(&local_130.captures_in_current_definition._M_t);
  std::
  vector<std::set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  ::~vector(&local_130.captures_stack);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  ::~vector(&local_130.undefined_back_references);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<peg::ParserGenerator::Instruction,_std::allocator<peg::ParserGenerator::Instruction>_>_>_>_>
  ::~_Rb_tree(&local_130.instructions._M_t);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  ::~vector(&local_130.duplicates_of_instruction);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  ::~vector(&local_130.duplicates_of_definition);
  _Var30._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.start._M_dataplus._M_p != &local_130.start.field_2) {
    operator_delete(local_130.start._M_dataplus._M_p,
                    local_130.start.field_2._M_allocated_capacity + 1);
    _Var30._M_pi = extraout_RDX_00;
  }
  if (local_130.grammar.
      super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_130.grammar.
               super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var30._M_pi = extraout_RDX_01;
  }
  sVar42.
  super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var30._M_pi;
  sVar42.
  super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = &this->g;
  return (shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
          )sVar42.
           super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<Grammar> perform_core(const char *s, size_t n,
                                        const Rules &rules, std::string &start,
                                        bool &enablePackratParsing, Log log) {
    Data data;
    auto &grammar = *data.grammar;

    // Built-in macros
    {
      // `%recover`
      {
        auto &rule = grammar[RECOVER_DEFINITION_NAME];
        rule <= ref(grammar, "x", "", false, {});
        rule.name = RECOVER_DEFINITION_NAME;
        rule.s_ = "[native]";
        rule.ignoreSemanticValue = true;
        rule.is_macro = true;
        rule.params = {"x"};
      }
    }

    std::any dt = &data;
    auto r = g["Grammar"].parse(s, n, dt, nullptr, log);

    if (!r.ret) {
      if (log) {
        if (r.error_info.message_pos) {
          auto line = line_info(s, r.error_info.message_pos);
          log(line.first, line.second, r.error_info.message,
              r.error_info.label);
        } else {
          auto line = line_info(s, r.error_info.error_pos);
          log(line.first, line.second, "syntax error", r.error_info.label);
        }
      }
      return nullptr;
    }

    // User provided rules
    for (auto [user_name, user_rule] : rules) {
      auto name = user_name;
      auto ignore = false;
      if (!name.empty() && name[0] == '~') {
        ignore = true;
        name.erase(0, 1);
      }
      if (!name.empty()) {
        auto &rule = grammar[name];
        rule <= user_rule;
        rule.name = name;
        rule.ignoreSemanticValue = ignore;
      }
    }

    // Check duplicated definitions
    auto ret = true;

    if (!data.duplicates_of_definition.empty()) {
      for (const auto &[name, ptr] : data.duplicates_of_definition) {
        if (log) {
          auto line = line_info(s, ptr);
          log(line.first, line.second,
              "The definition '" + name + "' is already defined.", "");
        }
      }
      ret = false;
    }

    // Check duplicated instructions
    if (!data.duplicates_of_instruction.empty()) {
      for (const auto &[type, ptr] : data.duplicates_of_instruction) {
        if (log) {
          auto line = line_info(s, ptr);
          log(line.first, line.second,
              "The instruction '" + type + "' is already defined.", "");
        }
      }
      ret = false;
    }

    // Check undefined back references
    if (!data.undefined_back_references.empty()) {
      for (const auto &[name, ptr] : data.undefined_back_references) {
        if (log) {
          auto line = line_info(s, ptr);
          log(line.first, line.second,
              "The back reference '" + name + "' is undefined.", "");
        }
      }
      ret = false;
    }

    // Set root definition
    auto &start_rule = grammar[data.start];

    // Check if the start rule has ignore operator
    {
      if (start_rule.ignoreSemanticValue) {
        if (log) {
          auto line = line_info(s, start_rule.s_);
          log(line.first, line.second,
              "Ignore operator cannot be applied to '" + start_rule.name + "'.",
              "");
        }
        ret = false;
      }
    }

    if (!ret) { return nullptr; }

    // Check missing definitions
    auto referenced = std::unordered_set<std::string>{
        WHITESPACE_DEFINITION_NAME,
        WORD_DEFINITION_NAME,
        RECOVER_DEFINITION_NAME,
        start_rule.name,
    };

    for (auto &[_, rule] : grammar) {
      ReferenceChecker vis(grammar, rule.params);
      rule.accept(vis);
      referenced.insert(vis.referenced.begin(), vis.referenced.end());
      for (const auto &[name, ptr] : vis.error_s) {
        if (log) {
          auto line = line_info(s, ptr);
          log(line.first, line.second, vis.error_message[name], "");
        }
        ret = false;
      }
    }

    for (auto &[name, rule] : grammar) {
      if (!referenced.count(name)) {
        if (log) {
          auto line = line_info(s, rule.s_);
          auto msg = "'" + name + "' is not referenced.";
          log(line.first, line.second, msg, "");
        }
      }
    }

    if (!ret) { return nullptr; }

    // Link references
    for (auto &x : grammar) {
      auto &rule = x.second;
      LinkReferences vis(grammar, rule.params);
      rule.accept(vis);
    }

    // Check left recursion
    ret = true;

    for (auto &[name, rule] : grammar) {
      DetectLeftRecursion vis(name);
      rule.accept(vis);
      if (vis.error_s) {
        if (log) {
          auto line = line_info(s, vis.error_s);
          log(line.first, line.second, "'" + name + "' is left recursive.", "");
        }
        ret = false;
      }
    }

    if (!ret) { return nullptr; }

    // Check infinite loop
    if (detect_infiniteLoop(data, start_rule, log, s)) { return nullptr; }

    // Automatic whitespace skipping
    if (grammar.count(WHITESPACE_DEFINITION_NAME)) {
      for (auto &x : grammar) {
        auto &rule = x.second;
        auto ope = rule.get_core_operator();
        if (IsLiteralToken::check(*ope)) { rule <= tok(ope); }
      }

      auto &rule = grammar[WHITESPACE_DEFINITION_NAME];
      start_rule.whitespaceOpe = wsp(rule.get_core_operator());

      if (detect_infiniteLoop(data, rule, log, s)) { return nullptr; }
    }

    // Word expression
    if (grammar.count(WORD_DEFINITION_NAME)) {
      auto &rule = grammar[WORD_DEFINITION_NAME];
      start_rule.wordOpe = rule.get_core_operator();

      if (detect_infiniteLoop(data, rule, log, s)) { return nullptr; }
    }

    // Apply instructions
    for (const auto &[name, instructions] : data.instructions) {
      auto &rule = grammar[name];

      for (const auto &instruction : instructions) {
        if (instruction.type == "precedence") {
          const auto &info =
              std::any_cast<PrecedenceClimbing::BinOpeInfo>(instruction.data);

          if (!apply_precedence_instruction(rule, info, s, log)) {
            return nullptr;
          }
        } else if (instruction.type == "error_message") {
          rule.error_message = std::any_cast<std::string>(instruction.data);
        } else if (instruction.type == "no_ast_opt") {
          rule.no_ast_opt = true;
        }
      }
    }

    // Set root definition
    start = data.start;
    enablePackratParsing = data.enablePackratParsing;

    return data.grammar;
  }